

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
MADPComponentDiscreteObservations::JointToIndividualObservationIndices
          (MADPComponentDiscreteObservations *this,Index jo_e,Scope *agSC)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  MADPComponentDiscreteObservations *in_RSI;
  allocator_type *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nr_A_e;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *jo_e_vec;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Index in_stack_ffffffffffffffbc;
  
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RCX);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xad43c2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,(size_type)in_RSI,in_RDI);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xad43e2);
  GetNrObservations(in_RSI);
  IndexTools::RestrictIndividualIndicesToScope<unsigned_long>
            (this_00,(Scope *)in_RSI,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI
            );
  IndexTools::JointToIndividualIndices
            (in_stack_ffffffffffffffbc,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             (CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0) & 0xffffffff00ffffff));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI;
}

Assistant:

std::vector<Index> MADPComponentDiscreteObservations::
JointToIndividualObservationIndices(
        Index jo_e, const Scope& agSC) const
{
    vector<size_t> nr_A_e(agSC.size());
    IndexTools::RestrictIndividualIndicesToScope(
        GetNrObservations(), agSC, nr_A_e);
    vector<Index> jo_e_vec = IndexTools::JointToIndividualIndices(jo_e, nr_A_e);
    return(jo_e_vec);
}